

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1
               (uint16_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 extraout_XMM0_Qa;
  CONV_BUF_TYPE *src1_00;
  uint16_t *dst_00;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  CONV_BUF_TYPE *src0_00;
  undefined8 extraout_XMM0_Qb_00;
  __m128i *round_offset_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  __m128i mask_h;
  __m128i mask_l;
  __m128i m1_acbd;
  __m128i m0_acbd;
  __m128i m1_ac;
  __m128i m0_ac;
  __m128i m_i11;
  __m128i m_i10;
  __m128i m_i01;
  __m128i m_i00;
  int j;
  int i;
  __m128i two_w;
  __m128i one_b;
  __m128i *in_stack_00000450;
  __m128i *in_stack_00000458;
  __m128i *in_stack_00000460;
  __m128i *in_stack_00000468;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  
  for (local_1ac = 0; local_1ac < in_stack_00000018; local_1ac = local_1ac + 1) {
    for (local_1b0 = 0; local_1b0 < in_stack_00000020; local_1b0 = local_1b0 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + (local_1b0 << 1)));
      xx_loadu_128((void *)(in_stack_00000008 + (local_1b0 << 1) + 0x10));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)in_stack_00000010 + (long)(local_1b0 << 1)));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)in_stack_00000010 + (long)(local_1b0 << 1) +
                           0x10));
      auVar3._8_8_ = extraout_XMM0_Qb;
      auVar3._0_8_ = extraout_XMM0_Qa;
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_8_ = dst_00;
      auVar4 = paddusb(auVar3,auVar2);
      auVar1._8_8_ = src0_00;
      auVar1._0_8_ = src1_00;
      auVar5._8_8_ = round_offset_00;
      auVar5._0_8_ = extraout_XMM0_Qa_00;
      auVar5 = paddusb(auVar1,auVar5);
      auVar6._8_8_ = 0x101010101010101;
      auVar6._0_8_ = 0x101010101010101;
      auVar6 = pmaddubsw(auVar4,auVar6);
      auVar4._8_8_ = 0x101010101010101;
      auVar4._0_8_ = 0x101010101010101;
      pmaddubsw(auVar5,auVar4);
      uStack_b0 = auVar6._8_2_;
      uStack_ae = auVar6._10_2_;
      uStack_ac = auVar6._12_2_;
      uStack_aa = auVar6._14_2_;
      highbd_blend_a64_d16_mask_w16_sse4_1
                (dst_00,src0_00,src1_00,round_offset_00,(int)((ulong)extraout_XMM0_Qa_00 >> 0x20),
                 (__m128i *)
                 CONCAT26(uStack_aa + 2,
                          CONCAT24(uStack_ac + 2,CONCAT22(uStack_ae + 2,uStack_b0 + 2))),
                 in_stack_00000450,in_stack_00000458,in_stack_00000460,in_stack_00000468);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(in_stack_00000010 << 1);
  }
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift, const __m128i *clip_low,
    const __m128i *clip_high, const __m128i *mask_max) {
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  for (int i = 0; i < h; i++) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m_i00 = xx_loadu_128(mask + 2 * j);
      const __m128i m_i01 = xx_loadu_128(mask + 2 * j + 16);
      const __m128i m_i10 = xx_loadu_128(mask + mask_stride + 2 * j);
      const __m128i m_i11 = xx_loadu_128(mask + mask_stride + 2 * j + 16);

      const __m128i m0_ac = _mm_adds_epu8(m_i00, m_i10);
      const __m128i m1_ac = _mm_adds_epu8(m_i01, m_i11);
      const __m128i m0_acbd = _mm_maddubs_epi16(m0_ac, one_b);
      const __m128i m1_acbd = _mm_maddubs_epi16(m1_ac, one_b);
      const __m128i mask_l = _mm_srli_epi16(_mm_add_epi16(m0_acbd, two_w), 2);
      const __m128i mask_h = _mm_srli_epi16(_mm_add_epi16(m1_acbd, two_w), 2);

      highbd_blend_a64_d16_mask_w16_sse4_1(
          dst + j, src0 + j, src1 + j, round_offset, shift, &mask_l, &mask_h,
          clip_low, clip_high, mask_max);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride * 2;
  }
}